

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

double google::protobuf::io::Tokenizer::ParseFloat(string *text)

{
  bool bVar1;
  LogMessage *pLVar2;
  char *in_RCX;
  undefined1 auVar3 [16];
  string_view src;
  string local_60;
  LogMessage local_30;
  Voidify local_19;
  double local_18;
  double result;
  string *text_local;
  
  local_18 = 0.0;
  result = (double)text;
  bVar1 = TryParseFloat(text,&local_18);
  if (!bVar1) {
    absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer.cc"
               ,0x3f9);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [85])
                               " Tokenizer::ParseFloat() passed text that could not have been tokenized as a float: "
                       );
    auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)result);
    src._M_len = auVar3._8_8_;
    src._M_str = in_RCX;
    absl::lts_20250127::CEscape_abi_cxx11_(&local_60,auVar3._0_8_,src);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,&local_60);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
    std::__cxx11::string::~string((string *)&local_60);
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_30);
  }
  return local_18;
}

Assistant:

double Tokenizer::ParseFloat(const std::string& text) {
  double result = 0;
  if (!TryParseFloat(text, &result)) {
    ABSL_DLOG(FATAL)
        << " Tokenizer::ParseFloat() passed text that could not have been"
           " tokenized as a float: "
        << absl::CEscape(text);
  }
  return result;
}